

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CustomUintFormatter<2,true>::
Ser<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
          (CustomUintFormatter<2,_true> *this,
          ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s,
          unsigned_short v)

{
  size_t sVar1;
  Span<unsigned_long> s_00;
  size_t __n;
  Span<const_std::byte> *in_RSI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar2;
  uint64_t raw;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  unsigned_long *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  undefined8 local_70;
  
  sVar1 = *(size_t *)(in_FS_OFFSET + 0x28);
  __n = sVar1;
  htobe64_internal(in_stack_ffffffffffffff58);
  Span<unsigned_long>::Span<unsigned_long,_0>
            ((Span<unsigned_long> *)in_RSI,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  s_00.m_size = in_stack_ffffffffffffff78;
  s_00.m_data = in_stack_ffffffffffffff70;
  AsBytes<unsigned_long>(s_00);
  SVar2 = Span<const_std::byte>::last
                    (in_RSI,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_70 = (void *)SVar2.m_size;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>::write
            ((ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *
             )in_RSI,(int)SVar2.m_data,local_70,__n);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }